

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall libtorrent::scrape_failed_alert::~scrape_failed_alert(scrape_failed_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_tracker_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_004dc350;
  p_Var2 = (this->super_tracker_alert).super_torrent_alert.handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x68);
  return;
}

Assistant:

struct TORRENT_EXPORT scrape_failed_alert final : tracker_alert
	{
		// internal
		TORRENT_UNEXPORT scrape_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, protocol_version v, string_view u, error_code const& e);
		TORRENT_UNEXPORT scrape_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, protocol_version v, string_view u, string_view m);

		TORRENT_DEFINE_ALERT_PRIO(scrape_failed_alert, 14, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::tracker | alert_category::error;
		std::string message() const override;

		// the error itself. This may indicate that the tracker sent an error
		// message (``error::tracker_failure``), in which case it can be
		// retrieved by calling ``error_message()``.
		error_code const error;

		// if the error indicates there is an associated message, this returns
		// that message. Otherwise and empty string.
		char const* error_message() const;

	private:
		aux::allocation_slot m_msg_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// contains a message describing the error.
		TORRENT_DEPRECATED std::string msg;
#endif
	}